

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highwayhash.cpp
# Opt level: O1

size_t __thiscall groundupdbext::HighwayHash::operator()(HighwayHash *this,char *data,size_t length)

{
  HighwayHashCatT<1U> *__dest;
  int i;
  long lVar1;
  HHStateT<1U> *pHVar2;
  HHStatePortable *pHVar3;
  byte bVar4;
  Lanes rotated_keys;
  uint64_t local_d8;
  uint64_t uStack_d0;
  uint64_t local_c8;
  uint64_t uStack_c0;
  HHStatePortable local_b8;
  
  bVar4 = 0;
  __dest = this->m_hh;
  lVar1 = 0;
  do {
    local_b8.v0[lVar1] = this->m_key[lVar1] << 0x20 | this->m_key[lVar1] >> 0x20;
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  (__dest->state_).mul0[2] = 0x13198a2e03707344;
  (__dest->state_).mul0[3] = 0x243f6a8885a308d3;
  (__dest->state_).mul0[0] = 0xdbe6d5d5fe4cce2f;
  (__dest->state_).mul0[1] = 0xa4093822299f31d0;
  (__dest->state_).mul1[0] = 0x3bd39e10cb0ef593;
  (__dest->state_).mul1[1] = 0xc0acf169b5f18a8c;
  (__dest->state_).mul1[2] = 0xbe5466cf34e90c6c;
  (__dest->state_).mul1[3] = 0x452821e638d01377;
  lVar1 = 0;
  do {
    *(ulong *)((long)(__dest->state_).v0 + lVar1) =
         *(ulong *)((long)this->m_key + lVar1) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init0 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  lVar1 = 0;
  do {
    *(ulong *)((long)(__dest->state_).v1 + lVar1) =
         *(ulong *)((long)local_b8.v0 + lVar1) ^
         *(ulong *)((long)&highwayhash::Portable::HHStatePortable::Reset(unsigned_long_const*)::
                           init1 + lVar1);
    lVar1 = lVar1 + 8;
  } while (lVar1 != 0x20);
  __dest->buffer_usage_ = 0;
  if (length < 0x20) {
    if (length != 0) {
      memcpy(__dest,data,length);
    }
    __dest->buffer_usage_ = __dest->buffer_usage_ + length;
  }
  else {
    pHVar2 = &__dest->state_;
    pHVar3 = &local_b8;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pHVar3->v0[0] = pHVar2->v0[0];
      pHVar2 = (HHStateT<1U> *)(pHVar2->v0 + 1);
      pHVar3 = (HHStatePortable *)(pHVar3->v0 + 1);
    }
    do {
      local_d8 = *(uint64_t *)data;
      uStack_d0 = *(uint64_t *)((long)data + 8);
      local_c8 = *(uint64_t *)((long)data + 0x10);
      uStack_c0 = *(uint64_t *)((long)data + 0x18);
      highwayhash::Portable::HHStatePortable::Update(&local_b8,(Lanes *)&local_d8);
      data = (char *)((long)data + 0x20);
      length = length - 0x20;
    } while (0x1f < length);
    __dest->buffer_usage_ = length;
    pHVar3 = &local_b8;
    pHVar2 = &__dest->state_;
    for (lVar1 = 0x10; lVar1 != 0; lVar1 = lVar1 + -1) {
      pHVar2->v0[0] = pHVar3->v0[0];
      pHVar3 = (HHStatePortable *)((long)pHVar3 + ((ulong)bVar4 * -2 + 1) * 8);
      pHVar2 = (HHStateT<1U> *)((long)pHVar2 + (ulong)bVar4 * -0x10 + 8);
    }
    if (length != 0) {
      memcpy(__dest,data,length);
    }
  }
  highwayhash::HighwayHashCatT<1U>::Finalize<unsigned_long>(this->m_hh,this->m_result);
  return *this->m_result;
}

Assistant:

std::size_t
HighwayHash::operator() (const char* data,std::size_t length) const noexcept {
  m_hh->Reset(m_key);
  m_hh->Append(data, length);
  m_hh->Finalize(m_result);
  return *m_result;
}